

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O1

void swrenderer::R_SetupBuffer(void)

{
  int fuzzoff;
  DCanvas *pDVar1;
  int iVar2;
  long lVar3;
  BYTE *pBVar4;
  
  fuzzoff = RenderTarget->Pitch;
  if (RenderTarget->Buffer != (BYTE *)0x0 || drawerargs::dc_pitch != fuzzoff) {
    pBVar4 = RenderTarget->Buffer + (long)viewwindowy * (long)fuzzoff + (long)viewwindowx;
    if (drawerargs::dc_pitch != fuzzoff) {
      drawerargs::dc_pitch = fuzzoff;
      R_InitFuzzTable(fuzzoff);
    }
    pDVar1 = RenderTarget;
    drawerargs::dc_destorg = pBVar4;
    if (0 < RenderTarget->Height) {
      iVar2 = 0;
      lVar3 = 0;
      do {
        (&ylookup)[lVar3] = iVar2;
        lVar3 = lVar3 + 1;
        iVar2 = iVar2 + fuzzoff;
      } while (lVar3 < pDVar1->Height);
    }
  }
  return;
}

Assistant:

void R_SetupBuffer ()
{
	static BYTE *lastbuff = NULL;

	int pitch = RenderTarget->GetPitch();
	BYTE *lineptr = RenderTarget->GetBuffer() + viewwindowy*pitch + viewwindowx;

	if (dc_pitch != pitch || lineptr != lastbuff)
	{
		if (dc_pitch != pitch)
		{
			dc_pitch = pitch;
			R_InitFuzzTable (pitch);
		}
		dc_destorg = lineptr;
		for (int i = 0; i < RenderTarget->GetHeight(); i++)
		{
			ylookup[i] = i * pitch;
		}
	}
}